

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O2

void * __thiscall dgMeshEffect::GetFirstVertex(dgMeshEffect *this)

{
  HaI32 HVar1;
  dgTreeNode *pdVar2;
  dgEdge *pdVar3;
  
  pdVar2 = dgTree<dgEdge,_long>::Minimum((dgTree<dgEdge,_long> *)this);
  if (pdVar2 != (dgTreeNode *)0x0) {
    HVar1 = dgPolyhedra::IncLRU(&this->super_dgPolyhedra);
    pdVar3 = &pdVar2->m_info;
    do {
      pdVar3->m_mark = HVar1;
      pdVar3 = pdVar3->m_twin->m_next;
    } while (pdVar3 != &pdVar2->m_info);
  }
  return pdVar2;
}

Assistant:

void* dgMeshEffect::GetFirstVertex ()
{
	Iterator iter (*this);
	iter.Begin();

	dgTreeNode* node = NULL;
	if (iter) {
		hacd::HaI32 mark = IncLRU();
		node = iter.GetNode();

		dgEdge* const edge = &node->GetInfo();
		dgEdge* ptr = edge;
		do {
			ptr->m_mark = mark;
			ptr = ptr->m_twin->m_next;
		} while (ptr != edge);
	}
	return node; 
}